

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForceMatrixDecomposition.cpp
# Opt level: O1

void __thiscall
OpenMD::ForceMatrixDecomposition::distributeInitialData(ForceMatrixDecomposition *this)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *pvVar2;
  vector<int,std::allocator<int>> *pvVar3;
  int j;
  SnapshotManager *pSVar4;
  Snapshot *this_00;
  SimInfo *pSVar5;
  void *pvVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  AtomType *pAVar10;
  long lVar11;
  iterator iVar12;
  vector<int,_std::allocator<int>_> *this_01;
  vector<int,_std::allocator<int>_> globalGroupMembership;
  int local_9c;
  vector<double,_std::allocator<double>_> local_98;
  vector<int,_std::allocator<int>_> local_80;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_68;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_60;
  long local_58;
  PairList *local_50;
  PairList *local_48;
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  *local_40;
  PairList *local_38;
  
  pSVar4 = (this->super_ForceDecomposition).sman_;
  this_00 = pSVar4->currentSnapshot_;
  (this->super_ForceDecomposition).snap_ = this_00;
  (this->super_ForceDecomposition).atomStorageLayout_ = pSVar4->atomStorageLayout_;
  (this->super_ForceDecomposition).ff_ = ((this->super_ForceDecomposition).info_)->forceField_;
  iVar8 = Snapshot::getNumberOfAtoms(this_00);
  this->nLocal_ = iVar8;
  uVar9 = SimInfo::getNLocalCutoffGroups((this->super_ForceDecomposition).info_);
  this->nGroups_ = uVar9;
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,&((this->super_ForceDecomposition).info_)->identArray_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->super_ForceDecomposition).idents,&local_80);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,&((this->super_ForceDecomposition).info_)->regions_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign
            (&(this->super_ForceDecomposition).regions,&local_80);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SimInfo::getGlobalAtomIndices(&local_80,(this->super_ForceDecomposition).info_);
  pvVar1 = &this->AtomLocalToGlobal;
  std::vector<int,_std::allocator<int>_>::_M_move_assign(pvVar1,&local_80);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  SimInfo::getGlobalGroupIndices(&local_80,(this->super_ForceDecomposition).info_);
  std::vector<int,_std::allocator<int>_>::_M_move_assign(&this->cgLocalToGlobal,&local_80);
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<int,_std::allocator<int>_>::vector
            (&local_80,&((this->super_ForceDecomposition).info_)->globalGroupMembership_);
  std::vector<double,_std::allocator<double>_>::vector
            (&local_98,&((this->super_ForceDecomposition).info_)->massFactors_);
  std::vector<double,_std::allocator<double>_>::_M_move_assign
            (&(this->super_ForceDecomposition).massFactors,&local_98);
  pvVar6 = (void *)CONCAT44(local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start._4_4_,
                            (int)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_start);
  if (pvVar6 != (void *)0x0) {
    operator_delete(pvVar6,(long)local_98.super__Vector_base<double,_std::allocator<double>_>.
                                 _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar6);
  }
  pSVar5 = (this->super_ForceDecomposition).info_;
  DataStorage::setStorageLayout
            (&((this->super_ForceDecomposition).snap_)->cgData,
             (uint)(this->super_ForceDecomposition).needVelocities_ * 2 + 1);
  pvVar2 = &(this->super_ForceDecomposition).excludesForAtom;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar2,(this->super_ForceDecomposition).excludesForAtom.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_40 = pvVar2;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar2,(long)this->nLocal_);
  pvVar2 = &(this->super_ForceDecomposition).toposForAtom;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar2,(this->super_ForceDecomposition).toposForAtom.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_60 = pvVar2;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar2,(long)this->nLocal_);
  pvVar2 = &(this->super_ForceDecomposition).topoDist;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar2,(this->super_ForceDecomposition).topoDist.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  local_68 = pvVar2;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar2,(long)this->nLocal_);
  iVar8 = this->nLocal_;
  if (0 < iVar8) {
    local_38 = &pSVar5->excludedInteractions_;
    local_48 = &pSVar5->oneThreeInteractions_;
    local_50 = &pSVar5->oneFourInteractions_;
    lVar11 = 0;
    do {
      iVar8 = (this->AtomLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      local_58 = lVar11;
      if (0 < this->nLocal_) {
        do {
          j = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_start
              [(int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start];
          bVar7 = PairList::hasPair(local_38,iVar8,j);
          if (bVar7) {
            pvVar3 = (vector<int,std::allocator<int>> *)
                     ((local_40->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar11);
            iVar12._M_current = *(int **)(pvVar3 + 8);
            if (iVar12._M_current == *(int **)(pvVar3 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar3,iVar12,(int *)&local_98);
            }
            else {
              *iVar12._M_current =
                   (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(int **)(pvVar3 + 8) = iVar12._M_current + 1;
            }
          }
          bVar7 = PairList::hasPair(&pSVar5->oneTwoInteractions_,iVar8,j);
          if (bVar7) {
            pvVar3 = (vector<int,std::allocator<int>> *)
                     ((local_60->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar11);
            iVar12._M_current = *(int **)(pvVar3 + 8);
            if (iVar12._M_current == *(int **)(pvVar3 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar3,iVar12,(int *)&local_98);
            }
            else {
              *iVar12._M_current =
                   (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(int **)(pvVar3 + 8) = iVar12._M_current + 1;
            }
            this_01 = (local_68->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar11;
            local_9c = 1;
            iVar12._M_current =
                 (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
            if (iVar12._M_current ==
                (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage) {
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (this_01,iVar12,&local_9c);
            }
            else {
              *iVar12._M_current = 1;
LAB_0023fab6:
              (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
              super__Vector_impl_data._M_finish = iVar12._M_current + 1;
            }
          }
          else {
            bVar7 = PairList::hasPair(local_48,iVar8,j);
            if (bVar7) {
              pvVar3 = (vector<int,std::allocator<int>> *)
                       ((local_60->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar11);
              iVar12._M_current = *(int **)(pvVar3 + 8);
              if (iVar12._M_current == *(int **)(pvVar3 + 0x10)) {
                std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          (pvVar3,iVar12,(int *)&local_98);
              }
              else {
                *iVar12._M_current =
                     (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                *(int **)(pvVar3 + 8) = iVar12._M_current + 1;
              }
              this_01 = (local_68->
                        super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                        )._M_impl.super__Vector_impl_data._M_start + lVar11;
              local_9c = 2;
              iVar12._M_current =
                   (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar12._M_current !=
                  (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                *iVar12._M_current = 2;
                goto LAB_0023fab6;
              }
              std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                        (this_01,iVar12,&local_9c);
            }
            else {
              bVar7 = PairList::hasPair(local_50,iVar8,j);
              if (bVar7) {
                pvVar3 = (vector<int,std::allocator<int>> *)
                         ((local_60->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar11);
                iVar12._M_current = *(int **)(pvVar3 + 8);
                if (iVar12._M_current == *(int **)(pvVar3 + 0x10)) {
                  std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (pvVar3,iVar12,(int *)&local_98);
                }
                else {
                  *iVar12._M_current =
                       (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start;
                  *(int **)(pvVar3 + 8) = iVar12._M_current + 1;
                }
                this_01 = (local_68->
                          super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar11;
                local_9c = 3;
                iVar12._M_current =
                     (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar12._M_current !=
                    (this_01->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  *iVar12._M_current = 3;
                  goto LAB_0023fab6;
                }
                std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                          (this_01,iVar12,&local_9c);
              }
            }
          }
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
        } while ((int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start < this->nLocal_);
      }
      lVar11 = local_58 + 1;
      iVar8 = this->nLocal_;
    } while (lVar11 < iVar8);
  }
  std::vector<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>::resize
            (&(this->super_ForceDecomposition).atypesLocal,(long)iVar8);
  if (0 < this->nLocal_) {
    lVar11 = 0;
    do {
      pAVar10 = ForceField::getAtomType
                          ((this->super_ForceDecomposition).ff_,
                           (this->super_ForceDecomposition).idents.
                           super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start[lVar11]);
      (this->super_ForceDecomposition).atypesLocal.
      super__Vector_base<OpenMD::AtomType_*,_std::allocator<OpenMD::AtomType_*>_>._M_impl.
      super__Vector_impl_data._M_start[lVar11] = pAVar10;
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->nLocal_);
  }
  pvVar2 = &(this->super_ForceDecomposition).groupList_;
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::_M_erase_at_end(pvVar2,(this->super_ForceDecomposition).groupList_.
                           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::resize(pvVar2,(long)this->nGroups_);
  if (0 < this->nGroups_) {
    lVar11 = 0;
    do {
      iVar8 = (this->cgLocalToGlobal).super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_start[lVar11];
      local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start._0_4_ = 0;
      if (0 < this->nLocal_) {
        do {
          if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start[(pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_start
                        [(int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start]] == iVar8) {
            pvVar3 = (vector<int,std::allocator<int>> *)
                     ((pvVar2->
                      super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + lVar11);
            iVar12._M_current = *(int **)(pvVar3 + 8);
            if (iVar12._M_current == *(int **)(pvVar3 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (pvVar3,iVar12,(int *)&local_98);
            }
            else {
              *iVar12._M_current =
                   (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              *(int **)(pvVar3 + 8) = iVar12._M_current + 1;
            }
          }
          local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start._0_4_ =
               (int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start + 1;
        } while ((int)local_98.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start < this->nLocal_);
      }
      lVar11 = lVar11 + 1;
    } while (lVar11 < this->nGroups_);
  }
  if (local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ForceMatrixDecomposition::distributeInitialData() {
    snap_              = sman_->getCurrentSnapshot();
    atomStorageLayout_ = sman_->getAtomStorageLayout();
    ff_                = info_->getForceField();
    nLocal_            = snap_->getNumberOfAtoms();

    nGroups_ = info_->getNLocalCutoffGroups();
    // gather the information for atomtype IDs (atids):
    idents                            = info_->getIdentArray();
    regions                           = info_->getRegions();
    AtomLocalToGlobal                 = info_->getGlobalAtomIndices();
    cgLocalToGlobal                   = info_->getGlobalGroupIndices();
    vector<int> globalGroupMembership = info_->getGlobalGroupMembership();

    massFactors = info_->getMassFactors();

    PairList* excludes = info_->getExcludedInteractions();
    PairList* oneTwo   = info_->getOneTwoInteractions();
    PairList* oneThree = info_->getOneThreeInteractions();
    PairList* oneFour  = info_->getOneFourInteractions();

    if (needVelocities_)
      snap_->cgData.setStorageLayout(DataStorage::dslPosition |
                                     DataStorage::dslVelocity);
    else
      snap_->cgData.setStorageLayout(DataStorage::dslPosition);

#ifdef IS_MPI

    MPI_Comm row = rowComm.getComm();
    MPI_Comm col = colComm.getComm();

    AtomPlanIntRow    = new Plan<int>(row, nLocal_);
    AtomPlanRealRow   = new Plan<RealType>(row, nLocal_);
    AtomPlanVectorRow = new Plan<Vector3d>(row, nLocal_);
    AtomPlanMatrixRow = new Plan<Mat3x3d>(row, nLocal_);
    AtomPlanPotRow    = new Plan<potVec>(row, nLocal_);

    AtomPlanIntColumn    = new Plan<int>(col, nLocal_);
    AtomPlanRealColumn   = new Plan<RealType>(col, nLocal_);
    AtomPlanVectorColumn = new Plan<Vector3d>(col, nLocal_);
    AtomPlanMatrixColumn = new Plan<Mat3x3d>(col, nLocal_);
    AtomPlanPotColumn    = new Plan<potVec>(col, nLocal_);

    cgPlanIntRow       = new Plan<int>(row, nGroups_);
    cgPlanVectorRow    = new Plan<Vector3d>(row, nGroups_);
    cgPlanIntColumn    = new Plan<int>(col, nGroups_);
    cgPlanVectorColumn = new Plan<Vector3d>(col, nGroups_);

    nAtomsInRow_  = AtomPlanIntRow->getSize();
    nAtomsInCol_  = AtomPlanIntColumn->getSize();
    nGroupsInRow_ = cgPlanIntRow->getSize();
    nGroupsInCol_ = cgPlanIntColumn->getSize();

    // Modify the data storage objects with the correct layouts and sizes:
    atomRowData.resize(nAtomsInRow_);
    atomRowData.setStorageLayout(atomStorageLayout_);
    atomColData.resize(nAtomsInCol_);
    atomColData.setStorageLayout(atomStorageLayout_);
    cgRowData.resize(nGroupsInRow_);
    cgRowData.setStorageLayout(DataStorage::dslPosition);
    cgColData.resize(nGroupsInCol_);
    if (needVelocities_)
      // we only need column velocities if we need them.
      cgColData.setStorageLayout(DataStorage::dslPosition |
                                 DataStorage::dslVelocity);
    else
      cgColData.setStorageLayout(DataStorage::dslPosition);

    identsRow.resize(nAtomsInRow_);
    identsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(idents, identsRow);
    AtomPlanIntColumn->gather(idents, identsCol);

    regionsRow.resize(nAtomsInRow_);
    regionsCol.resize(nAtomsInCol_);

    AtomPlanIntRow->gather(regions, regionsRow);
    AtomPlanIntColumn->gather(regions, regionsCol);

    // allocate memory for the parallel objects
    atypesRow.resize(nAtomsInRow_);
    atypesCol.resize(nAtomsInCol_);

    for (int i = 0; i < nAtomsInRow_; i++)
      atypesRow[i] = ff_->getAtomType(identsRow[i]);
    for (int i = 0; i < nAtomsInCol_; i++)
      atypesCol[i] = ff_->getAtomType(identsCol[i]);

    pot_row.resize(nAtomsInRow_);
    pot_col.resize(nAtomsInCol_);

    expot_row.resize(nAtomsInRow_);
    expot_col.resize(nAtomsInCol_);

    selepot_row.resize(nAtomsInRow_);
    selepot_col.resize(nAtomsInCol_);

    AtomRowToGlobal.resize(nAtomsInRow_);
    AtomColToGlobal.resize(nAtomsInCol_);
    AtomPlanIntRow->gather(AtomLocalToGlobal, AtomRowToGlobal);
    AtomPlanIntColumn->gather(AtomLocalToGlobal, AtomColToGlobal);

    cgRowToGlobal.resize(nGroupsInRow_);
    cgColToGlobal.resize(nGroupsInCol_);
    cgPlanIntRow->gather(cgLocalToGlobal, cgRowToGlobal);
    cgPlanIntColumn->gather(cgLocalToGlobal, cgColToGlobal);

    massFactorsRow.resize(nAtomsInRow_);
    massFactorsCol.resize(nAtomsInCol_);
    AtomPlanRealRow->gather(massFactors, massFactorsRow);
    AtomPlanRealColumn->gather(massFactors, massFactorsCol);

    groupListRow_.clear();
    groupListRow_.resize(nGroupsInRow_);
    for (int i = 0; i < nGroupsInRow_; i++) {
      int gid = cgRowToGlobal[i];
      for (int j = 0; j < nAtomsInRow_; j++) {
        int aid = AtomRowToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListRow_[i].push_back(j);
      }
    }

    groupListCol_.clear();
    groupListCol_.resize(nGroupsInCol_);
    for (int i = 0; i < nGroupsInCol_; i++) {
      int gid = cgColToGlobal[i];
      for (int j = 0; j < nAtomsInCol_; j++) {
        int aid = AtomColToGlobal[j];
        if (globalGroupMembership[aid] == gid) groupListCol_[i].push_back(j);
      }
    }

    excludesForAtom.clear();
    excludesForAtom.resize(nAtomsInRow_);
    toposForAtom.clear();
    toposForAtom.resize(nAtomsInRow_);
    topoDist.clear();
    topoDist.resize(nAtomsInRow_);
    for (int i = 0; i < nAtomsInRow_; i++) {
      int iglob = AtomRowToGlobal[i];

      for (int j = 0; j < nAtomsInCol_; j++) {
        int jglob = AtomColToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }

#else
    excludesForAtom.clear();
    excludesForAtom.resize(nLocal_);
    toposForAtom.clear();
    toposForAtom.resize(nLocal_);
    topoDist.clear();
    topoDist.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++) {
      int iglob = AtomLocalToGlobal[i];

      for (int j = 0; j < nLocal_; j++) {
        int jglob = AtomLocalToGlobal[j];

        if (excludes->hasPair(iglob, jglob)) excludesForAtom[i].push_back(j);

        if (oneTwo->hasPair(iglob, jglob)) {
          toposForAtom[i].push_back(j);
          topoDist[i].push_back(1);
        } else {
          if (oneThree->hasPair(iglob, jglob)) {
            toposForAtom[i].push_back(j);
            topoDist[i].push_back(2);
          } else {
            if (oneFour->hasPair(iglob, jglob)) {
              toposForAtom[i].push_back(j);
              topoDist[i].push_back(3);
            }
          }
        }
      }
    }
#endif

    // allocate memory for the parallel objects
    atypesLocal.resize(nLocal_);

    for (int i = 0; i < nLocal_; i++)
      atypesLocal[i] = ff_->getAtomType(idents[i]);

    groupList_.clear();
    groupList_.resize(nGroups_);
    for (int i = 0; i < nGroups_; i++) {
      int gid = cgLocalToGlobal[i];
      for (int j = 0; j < nLocal_; j++) {
        int aid = AtomLocalToGlobal[j];
        if (globalGroupMembership[aid] == gid) { groupList_[i].push_back(j); }
      }
    }
  }